

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int solver2_analyze_final(sat_solver2 *s,clause *conf,int skip_first)

{
  byte bVar1;
  int *piVar2;
  int *__ptr;
  varinfo2 *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  clause *cls;
  
  if (-1 < (s->conf_final).size) {
    (s->conf_final).size = 0;
    if (s->root_level == 0) {
      return s->hProofLast;
    }
    proof_chain_start(s,conf);
    if ((s->tagged).size != 0) {
      __assert_fail("veci_size(&s->tagged) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x271,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    if (skip_first < (int)((uint)*conf >> 0xb)) {
      lVar7 = (long)skip_first;
      do {
        if ((uint)conf[lVar7 + 1] < 2) break;
        iVar4 = (int)conf[lVar7 + 1] >> 1;
        if (s->levels[iVar4] == 0) {
          proof_chain_resolve(s,(clause *)0x0,iVar4);
        }
        else {
          pvVar3 = s->vi;
          bVar1 = *(byte *)(pvVar3 + iVar4);
          if ((bVar1 & 0x3c) == 0) {
            uVar5 = (s->tagged).size;
            piVar2 = (s->tagged).ptr;
            if (uVar5 == (s->tagged).cap) {
              iVar9 = (uVar5 >> 1) * 3;
              if ((int)uVar5 < 4) {
                iVar9 = uVar5 * 2;
              }
              if (piVar2 == (int *)0x0) {
                piVar2 = (int *)malloc((long)iVar9 << 2);
              }
              else {
                piVar2 = (int *)realloc(piVar2,(long)iVar9 << 2);
              }
              (s->tagged).ptr = piVar2;
              if (piVar2 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       (double)(s->tagged).cap * 9.5367431640625e-07,
                       (double)iVar9 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->tagged).cap = iVar9;
              uVar5 = (s->tagged).size;
              pvVar3 = s->vi;
            }
            (s->tagged).size = uVar5 + 1;
            piVar2[(int)uVar5] = iVar4;
            bVar1 = *(byte *)(pvVar3 + iVar4);
          }
          *(byte *)(pvVar3 + iVar4) = bVar1 & 0xc3 | 4;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (long)(ulong)((uint)*conf >> 0xb));
    }
    if (s->root_level < (s->trail_lim).size) {
      __assert_fail("s->root_level >= veci_size(&s->trail_lim)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x278,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
    }
    lVar7 = (long)s->qtail;
    if (*(s->trail_lim).ptr < s->qtail) {
      do {
        uVar5 = s->trail[lVar7 + -1];
        iVar4 = (int)uVar5 >> 1;
        if (((uint)s->vi[iVar4] & 0x3c) != 0) {
          uVar6 = s->reasons[iVar4];
          if (uVar6 == 0) {
            if (s->levels[iVar4] == 0) {
              __assert_fail("var_level(s,x)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x287,"int solver2_analyze_final(sat_solver2 *, clause *, int)");
            }
            uVar6 = (s->conf_final).size;
            piVar2 = (s->conf_final).ptr;
            if (uVar6 == (s->conf_final).cap) {
              iVar4 = (uVar6 >> 1) * 3;
              if ((int)uVar6 < 4) {
                iVar4 = uVar6 * 2;
              }
              if (piVar2 == (int *)0x0) {
                piVar2 = (int *)malloc((long)iVar4 << 2);
              }
              else {
                piVar2 = (int *)realloc(piVar2,(long)iVar4 << 2);
              }
              (s->conf_final).ptr = piVar2;
              if (piVar2 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       (double)(s->conf_final).cap * 9.5367431640625e-07,
                       (double)iVar4 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->conf_final).cap = iVar4;
              uVar6 = (s->conf_final).size;
            }
            (s->conf_final).size = uVar6 + 1;
            piVar2[(int)uVar6] = uVar5 ^ 1;
          }
          else {
            uVar5 = (s->Mem).uPageMask & uVar6;
            if (uVar5 == 0) {
              __assert_fail("k",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                            ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
            }
            piVar2 = (s->Mem).pPages[(int)uVar6 >> ((byte)(s->Mem).nPageSize & 0x1f)];
            cls = (clause *)(piVar2 + (int)uVar5);
            proof_chain_resolve(s,cls,iVar4);
            if (0xfff < (uint)*cls) {
              uVar8 = 1;
              do {
                uVar6 = piVar2[(long)(int)uVar5 + uVar8 + 1];
                if (uVar6 < 2) break;
                iVar4 = (int)uVar6 >> 1;
                if (s->levels[iVar4] == 0) {
                  proof_chain_resolve(s,(clause *)0x0,iVar4);
                }
                else {
                  pvVar3 = s->vi;
                  bVar1 = *(byte *)(pvVar3 + iVar4);
                  if ((bVar1 & 0x3c) == 0) {
                    uVar6 = (s->tagged).size;
                    __ptr = (s->tagged).ptr;
                    if (uVar6 == (s->tagged).cap) {
                      iVar9 = (uVar6 >> 1) * 3;
                      if ((int)uVar6 < 4) {
                        iVar9 = uVar6 * 2;
                      }
                      if (__ptr == (int *)0x0) {
                        __ptr = (int *)malloc((long)iVar9 << 2);
                      }
                      else {
                        __ptr = (int *)realloc(__ptr,(long)iVar9 << 2);
                      }
                      (s->tagged).ptr = __ptr;
                      if (__ptr == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               (double)(s->tagged).cap * 9.5367431640625e-07,
                               (double)iVar9 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->tagged).cap = iVar9;
                      uVar6 = (s->tagged).size;
                      pvVar3 = s->vi;
                    }
                    (s->tagged).size = uVar6 + 1;
                    __ptr[(int)uVar6] = iVar4;
                    bVar1 = *(byte *)(pvVar3 + iVar4);
                  }
                  *(byte *)(pvVar3 + iVar4) = bVar1 & 0xc3 | 4;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < (uint)*cls >> 0xb);
            }
          }
        }
        lVar7 = lVar7 + -1;
      } while (*(s->trail_lim).ptr < lVar7);
    }
    iVar4 = (s->tagged).size;
    if (0 < iVar4) {
      piVar2 = (s->tagged).ptr;
      lVar7 = 0;
      do {
        *(byte *)(s->vi + piVar2[lVar7]) = *(byte *)(s->vi + piVar2[lVar7]) & 0xc3;
        lVar7 = lVar7 + 1;
        iVar4 = (s->tagged).size;
      } while (lVar7 < iVar4);
    }
    if (-1 < iVar4) {
      (s->tagged).size = 0;
      iVar4 = proof_chain_stop(s);
      return iVar4;
    }
  }
  __assert_fail("k <= v->size",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                ,0x30,"void veci_resize(veci *, int)");
}

Assistant:

static int solver2_analyze_final(sat_solver2* s, clause* conf, int skip_first)
{
    int i, j, x;//, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return s->hProofLast;
    proof_chain_start( s, conf );
    assert( veci_size(&s->tagged) == 0 );
    clause_foreach_var( conf, x, i, skip_first ){
        if ( var_level(s,x) )
            var_set_tag(s, x, 1);
        else
            proof_chain_resolve( s, NULL, x );
    }
    assert( s->root_level >= veci_size(&s->trail_lim) );
//    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = s->qtail-1; i >= (veci_begin(&s->trail_lim))[0]; i--){
        x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            clause* c = clause2_read(s, var_reason(s,x));
            if (c){
                proof_chain_resolve( s, c, x );
                clause_foreach_var( c, x, j, 1 ){
                    if ( var_level(s,x) )
                        var_set_tag(s, x, 1);
                    else
                        proof_chain_resolve( s, NULL, x );
                }
            }else {
                assert( var_level(s,x) );
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }
        }
    }
    solver2_clear_tags(s,0);
    return proof_chain_stop( s );
}